

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001ab130 = 0x2e2e2e2e2e2e2e;
    uRam00000000001ab137._0_1_ = '.';
    uRam00000000001ab137._1_1_ = '.';
    uRam00000000001ab137._2_1_ = '.';
    uRam00000000001ab137._3_1_ = '.';
    uRam00000000001ab137._4_1_ = '.';
    uRam00000000001ab137._5_1_ = '.';
    uRam00000000001ab137._6_1_ = '.';
    uRam00000000001ab137._7_1_ = '.';
    DAT_001ab120 = '.';
    DAT_001ab120_1._0_1_ = '.';
    DAT_001ab120_1._1_1_ = '.';
    DAT_001ab120_1._2_1_ = '.';
    DAT_001ab120_1._3_1_ = '.';
    DAT_001ab120_1._4_1_ = '.';
    DAT_001ab120_1._5_1_ = '.';
    DAT_001ab120_1._6_1_ = '.';
    uRam00000000001ab128 = 0x2e2e2e2e2e2e2e;
    DAT_001ab12f = 0x2e;
    DAT_001ab110 = '.';
    DAT_001ab110_1._0_1_ = '.';
    DAT_001ab110_1._1_1_ = '.';
    DAT_001ab110_1._2_1_ = '.';
    DAT_001ab110_1._3_1_ = '.';
    DAT_001ab110_1._4_1_ = '.';
    DAT_001ab110_1._5_1_ = '.';
    DAT_001ab110_1._6_1_ = '.';
    uRam00000000001ab118._0_1_ = '.';
    uRam00000000001ab118._1_1_ = '.';
    uRam00000000001ab118._2_1_ = '.';
    uRam00000000001ab118._3_1_ = '.';
    uRam00000000001ab118._4_1_ = '.';
    uRam00000000001ab118._5_1_ = '.';
    uRam00000000001ab118._6_1_ = '.';
    uRam00000000001ab118._7_1_ = '.';
    DAT_001ab100 = '.';
    DAT_001ab100_1._0_1_ = '.';
    DAT_001ab100_1._1_1_ = '.';
    DAT_001ab100_1._2_1_ = '.';
    DAT_001ab100_1._3_1_ = '.';
    DAT_001ab100_1._4_1_ = '.';
    DAT_001ab100_1._5_1_ = '.';
    DAT_001ab100_1._6_1_ = '.';
    uRam00000000001ab108._0_1_ = '.';
    uRam00000000001ab108._1_1_ = '.';
    uRam00000000001ab108._2_1_ = '.';
    uRam00000000001ab108._3_1_ = '.';
    uRam00000000001ab108._4_1_ = '.';
    uRam00000000001ab108._5_1_ = '.';
    uRam00000000001ab108._6_1_ = '.';
    uRam00000000001ab108._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001ab0f8._0_1_ = '.';
    uRam00000000001ab0f8._1_1_ = '.';
    uRam00000000001ab0f8._2_1_ = '.';
    uRam00000000001ab0f8._3_1_ = '.';
    uRam00000000001ab0f8._4_1_ = '.';
    uRam00000000001ab0f8._5_1_ = '.';
    uRam00000000001ab0f8._6_1_ = '.';
    uRam00000000001ab0f8._7_1_ = '.';
    DAT_001ab13f = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}